

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O0

uint64 __thiscall
libebml::EbmlVoid::Overwrite
          (EbmlVoid *this,EbmlElement *EltToVoid,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint64 uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  uint64 CurrentPosition;
  bool bWithDefault_local;
  bool ComeBackAfterward_local;
  IOCallback *output_local;
  EbmlElement *EltToVoid_local;
  EbmlVoid *this_local;
  
  uVar8 = EbmlElement::GetElementPosition(EltToVoid);
  if (uVar8 == 0) {
    this_local = (EbmlVoid *)0x0;
  }
  else {
    iVar4 = (*EltToVoid->_vptr_EbmlElement[9])();
    bVar1 = EbmlElement::HeadSize(EltToVoid);
    if (CONCAT44(extraout_var,iVar4) + (ulong)bVar1 < 2) {
      this_local = (EbmlVoid *)0x0;
    }
    else {
      iVar4 = (*output->_vptr_IOCallback[5])();
      uVar8 = EbmlElement::GetElementPosition(EltToVoid);
      (*output->_vptr_IOCallback[3])(output,uVar8,0);
      iVar5 = (*EltToVoid->_vptr_EbmlElement[9])();
      bVar1 = EbmlElement::HeadSize(EltToVoid);
      SetSize(this,(CONCAT44(extraout_var_01,iVar5) + (ulong)bVar1) - 1);
      iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      uVar7 = EbmlElement::GetSizeLength((EbmlElement *)this);
      bVar2 = EbmlElement::IsFiniteSize((EbmlElement *)this);
      iVar6 = CodedSizeLength(CONCAT44(extraout_var_03,iVar6),uVar7,bVar2);
      SetSize(this,CONCAT44(extraout_var_02,iVar5) - (long)iVar6);
      iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      bVar1 = EbmlElement::HeadSize((EbmlElement *)this);
      iVar6 = (*EltToVoid->_vptr_EbmlElement[9])();
      bVar3 = EbmlElement::HeadSize(EltToVoid);
      if (CONCAT44(extraout_var_04,iVar5) + (ulong)bVar1 !=
          CONCAT44(extraout_var_05,iVar6) + (ulong)bVar3) {
        iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        SetSize(this,CONCAT44(extraout_var_06,iVar5) - 1);
        iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
        uVar7 = EbmlElement::GetSizeLength((EbmlElement *)this);
        bVar2 = EbmlElement::IsFiniteSize((EbmlElement *)this);
        iVar5 = CodedSizeLength(CONCAT44(extraout_var_07,iVar5),uVar7,bVar2);
        EbmlElement::SetSizeLength((EbmlElement *)this,iVar5 + 1);
      }
      iVar5 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])();
      if (CONCAT44(extraout_var_08,iVar5) != 0) {
        EbmlElement::RenderHead((EbmlElement *)this,output,false,bWithDefault,false);
      }
      if (ComeBackAfterward) {
        (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var_00,iVar4),0);
      }
      iVar4 = (*EltToVoid->_vptr_EbmlElement[9])();
      bVar1 = EbmlElement::HeadSize(EltToVoid);
      this_local = (EbmlVoid *)(CONCAT44(extraout_var_09,iVar4) + (ulong)bVar1);
    }
  }
  return (uint64)this_local;
}

Assistant:

uint64 EbmlVoid::Overwrite(const EbmlElement & EltToVoid, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  //  EltToVoid.UpdateSize(bWithDefault);
  if (EltToVoid.GetElementPosition() == 0) {
    // this element has never been written
    return 0;
  }
  if (EltToVoid.GetSize() + EltToVoid.HeadSize() <2) {
    // the element can't be written here !
    return 0;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(EltToVoid.GetElementPosition());

  // compute the size of the voided data based on the original one
  SetSize(EltToVoid.GetSize() + EltToVoid.HeadSize() - 1); // 1 for the ID
  SetSize(GetSize() - CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()));
  // make sure we handle even the strange cases
  //uint32 A1 = GetSize() + HeadSize();
  //uint32 A2 = EltToVoid.GetSize() + EltToVoid.HeadSize();
  if (GetSize() + HeadSize() != EltToVoid.GetSize() + EltToVoid.HeadSize()) {
    SetSize(GetSize()-1);
    SetSizeLength(CodedSizeLength(GetSize(), GetSizeLength(), IsFiniteSize()) + 1);
  }

  if (GetSize() != 0) {
    RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return EltToVoid.GetSize() + EltToVoid.HeadSize();
}